

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getRcut(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  undefined8 local_58;
  
  getFuncflParam((EAMAdapter *)funcflParam.dr);
  FuncflParameters::~FuncflParameters(local_58);
  return (RealType)local_58;
}

Assistant:

RealType EAMAdapter::getRcut() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.rcut;
  }